

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine_generic.c
# Opt level: O1

rt_function_error_t exec_affine_generic(rt_function_t *f)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  code *pcVar4;
  int bpos;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  puVar2 = *f->local_context;
  if (0 < *(int *)(puVar2 + 9)) {
    iVar5 = 0;
    do {
      (*(code *)puVar2[10])(0,puVar2[8],iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 < *(int *)(puVar2 + 9));
  }
  if (0 < *(int *)(puVar2 + 0xc)) {
    iVar5 = 0;
    do {
      iVar9 = *(int *)(puVar2 + 0xd) * iVar5;
      if (0 < *(int *)(puVar2 + 0xd)) {
        iVar7 = *(int *)((long)puVar2 + 100);
        iVar6 = 0;
        do {
          iVar1 = *(int *)((long)puVar2 + 100);
          fVar10 = (float)(*(code *)puVar2[0xb])(puVar2[8]);
          if (0 < *(int *)((long)puVar2 + 100)) {
            iVar8 = 0;
            do {
              fVar11 = (float)(*(code *)puVar2[3])(puVar2[2],iVar1 * iVar6 + iVar8);
              fVar12 = (float)(*(code *)puVar2[1])(*puVar2,iVar7 * iVar5 + iVar8);
              fVar10 = fVar10 + fVar12 * fVar11;
              iVar8 = iVar8 + 1;
            } while (iVar8 < *(int *)((long)puVar2 + 100));
          }
          if (puVar2[6] != 0) {
            fVar11 = (float)(*(code *)puVar2[7])(puVar2[6],iVar6);
            fVar10 = fVar10 * fVar11;
          }
          (*(code *)puVar2[10])(fVar10,puVar2[8],iVar6 + iVar9);
          iVar6 = iVar6 + 1;
        } while (iVar6 < *(int *)(puVar2 + 0xd));
      }
      if ((puVar2[4] != 0) && (0 < *(int *)(puVar2 + 0xd))) {
        iVar7 = 0;
        do {
          iVar6 = iVar7 + iVar9;
          uVar3 = puVar2[8];
          pcVar4 = (code *)puVar2[10];
          fVar10 = (float)(*(code *)puVar2[0xb])(uVar3,iVar6);
          fVar11 = (float)(*(code *)puVar2[5])(puVar2[4],iVar7);
          (*pcVar4)(fVar11 + fVar10,uVar3,iVar6);
          iVar7 = iVar7 + 1;
        } while (iVar7 < *(int *)(puVar2 + 0xd));
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *(int *)(puVar2 + 0xc));
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_affine_generic(rt_function_t *f) {
  affine_private_t *p =
      (affine_private_t *)(((affine_local_context_t *)(f->local_context))
                               ->data);
  int i, j, k; // Iterators.

  // Clear output
  for (i = 0; i < p->output_size; i++) {
    p->set_output(p->output, i, 0);
  }

  for (k = 0; k < p->base_loop_size; k++) {
    int output_offset = k * p->output_loop_size;
    int input_offset = k * p->input_loop_size;

    // Weight
    for (j = 0; j < p->output_loop_size; ++j) {
      int opos = output_offset + j;
      int weight_offset = j * p->input_loop_size;
      float y0 = p->get_output(p->output, opos);

      for (i = 0; i < p->input_loop_size; ++i) {
        int ipos = input_offset + i;
        int wpos = weight_offset + i;

        float w = p->get_weight(p->weight, wpos);
        float x = p->get_input(p->input, ipos);
        y0 += x * w;
      }

      if (p->alpha) {
        y0 *= p->get_alpha(p->alpha, j);
      }

      p->set_output(p->output, opos, y0);
    }

    // Bias
    if (p->bias) {
      for (i = 0; i < p->output_loop_size; i++) {
        int opos = output_offset + i;
        int bpos = i;
        p->set_output(p->output, opos,
                      p->get_output(p->output, opos) +
                          p->get_bias(p->bias, bpos));
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}